

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3ca8ed::Nrom_creation_fails_with_bad_rom_sizes_Test::TestBody
          (Nrom_creation_fails_with_bad_rom_sizes_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Mapper in_R8D;
  Mapper MVar3;
  _Alloc_hider _Var4;
  AssertHelper local_370;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368 [4];
  string bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328 [12];
  stringstream ss;
  
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&bytes,(_anonymous_namespace_ *)0x0,'\x01','\0',in_R8D);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&bytes,_S_out|_S_in);
  paVar1 = &local_328[0].field_2;
  local_328[0].field_2._M_allocated_capacity = 0;
  local_328[0].field_2._8_8_ = 0;
  local_328[0]._M_string_length = 0;
  local_328[0]._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    n_e_s::core::RomFactory::from_bytes((RomFactory *)local_368,(istream *)&ss);
    if (local_368[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (local_328,
             "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::Message::Message((Message *)local_368);
  _Var4._M_p = local_328[0]._M_dataplus._M_p;
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
             ,0x74,local_328[0]._M_dataplus._M_p);
  MVar3 = (Mapper)_Var4._M_p;
  testing::internal::AssertHelper::operator=(&local_370,(Message *)local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  if (local_368[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_328);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (local_328,(_anonymous_namespace_ *)0x1,'\x01','\0',MVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&bytes,local_328);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(&bytes);
  std::__cxx11::stringstream::stringstream((stringstream *)local_328,(string *)&bytes,_S_out|_S_in);
  std::__cxx11::stringstream::operator=((stringstream *)&ss,(stringstream *)local_328);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  local_328[0].field_2._M_allocated_capacity = 0;
  local_328[0].field_2._8_8_ = 0;
  local_328[0]._M_string_length = 0;
  local_328[0]._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    n_e_s::core::RomFactory::from_bytes((RomFactory *)local_368,(istream *)&ss);
    if (local_368[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (local_328,
             "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::Message::Message((Message *)local_368);
  _Var4._M_p = local_328[0]._M_dataplus._M_p;
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
             ,0x79,local_328[0]._M_dataplus._M_p);
  MVar3 = (Mapper)_Var4._M_p;
  testing::internal::AssertHelper::operator=(&local_370,(Message *)local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  if (local_368[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_328);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (local_328,(_anonymous_namespace_ *)0x3,'\x01','\0',MVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&bytes,local_328);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::stringstream::stringstream((stringstream *)local_328,(string *)&bytes,_S_out|_S_in);
  std::__cxx11::stringstream::operator=((stringstream *)&ss,(stringstream *)local_328);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  local_328[0].field_2._M_allocated_capacity = 0;
  local_328[0].field_2._8_8_ = 0;
  local_328[0]._M_string_length = 0;
  local_328[0]._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    n_e_s::core::RomFactory::from_bytes((RomFactory *)local_368,(istream *)&ss);
    if (local_368[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (local_328,
             "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::Message::Message((Message *)local_368);
  _Var4._M_p = local_328[0]._M_dataplus._M_p;
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
             ,0x7d,local_328[0]._M_dataplus._M_p);
  MVar3 = (Mapper)_Var4._M_p;
  testing::internal::AssertHelper::operator=(&local_370,(Message *)local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  if (local_368[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_328);
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (local_328,(_anonymous_namespace_ *)0x1,'\x02','\0',MVar3);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&bytes,local_328);
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::stringstream::stringstream((stringstream *)local_328,(string *)&bytes,_S_out|_S_in);
  std::__cxx11::stringstream::operator=((stringstream *)&ss,(stringstream *)local_328);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_328);
  local_328[0].field_2._M_allocated_capacity = 0;
  local_328[0].field_2._8_8_ = 0;
  local_328[0]._M_string_length = 0;
  local_328[0]._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    n_e_s::core::RomFactory::from_bytes((RomFactory *)local_368,(istream *)&ss);
    if (local_368[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (local_328,
             "Expected: auto tmp = RomFactory::from_bytes(ss) throws an exception of type std::invalid_argument.\n  Actual: it throws nothing."
            );
  testing::Message::Message((Message *)local_368);
  testing::internal::AssertHelper::AssertHelper
            (&local_370,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/nes_core-src/core/test/src/test_rom.cpp"
             ,0x81,local_328[0]._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_370,(Message *)local_368);
  testing::internal::AssertHelper::~AssertHelper(&local_370);
  if (local_368[0]._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_368[0]._M_head_impl + 8))();
  }
  std::__cxx11::string::~string((string *)local_328);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&bytes);
  return;
}

Assistant:

TEST(Nrom, creation_fails_with_bad_rom_sizes) {
    std::string bytes{nrom_bytes(0, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 1, Mapper::Nrom);
    bytes.pop_back();
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(3, 1, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);

    bytes = nrom_bytes(1, 2, Mapper::Nrom);
    ss = std::stringstream(bytes);
    EXPECT_THROW(auto tmp = RomFactory::from_bytes(ss), std::invalid_argument);
}